

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

QItemSelection * __thiscall
QItemSelectionModelPrivate::expandSelection
          (QItemSelectionModelPrivate *this,QItemSelection *selection,SelectionFlags command)

{
  QAbstractItemModel *pQVar1;
  SelectionFlags command_00;
  undefined1 *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  qsizetype qVar8;
  arrow_operator_result ppQVar9;
  QModelIndex *topLeft;
  QList<QItemSelectionRange> *in_RDX;
  QItemSelection *in_RDI;
  long in_FS_OFFSET;
  int rowCount;
  int i_1;
  int colCount;
  int i;
  QItemSelection *expanded;
  QModelIndex br_1;
  QModelIndex tl_1;
  QModelIndex parent_1;
  QModelIndex br;
  QModelIndex tl;
  QModelIndex parent;
  undefined4 in_stack_fffffffffffffde8;
  SelectionFlag in_stack_fffffffffffffdec;
  QItemSelectionRange *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  QModelIndex *in_stack_fffffffffffffe08;
  QItemSelection *in_stack_fffffffffffffe10;
  QItemSelection *this_00;
  bool local_171;
  byte local_151;
  int local_14c;
  int in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [4];
  SelectionFlags command_01;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_98;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_18;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_14;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x82a18b);
  local_151 = 0;
  if (bVar3) {
    local_10.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QFlags<QItemSelectionModel::SelectionFlag>::operator&
                   ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdf0,
                    in_stack_fffffffffffffdec);
    bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_10);
    local_171 = true;
    if (!bVar3) {
      local_14.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
           (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
           QFlags<QItemSelectionModel::SelectionFlag>::operator&
                     ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdf0,
                      in_stack_fffffffffffffdec);
      local_171 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    }
    local_151 = local_171 ^ 0xff;
  }
  if ((local_151 & 1) == 0) {
    in_stack_fffffffffffffecc = in_stack_fffffffffffffecc & 0xffffff;
    (in_RDI->super_QList<QItemSelectionRange>).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->super_QList<QItemSelectionRange>).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelection::QItemSelection((QItemSelection *)0x82a26c);
    local_18.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QFlags<QItemSelectionModel::SelectionFlag>::operator&
                   ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdf0,
                    in_stack_fffffffffffffdec);
    bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_18);
    if (bVar3) {
      for (in_stack_fffffffffffffec8 = 0; lVar7 = (long)in_stack_fffffffffffffec8,
          qVar8 = QList<QItemSelectionRange>::size(in_RDX), lVar7 < qVar8;
          in_stack_fffffffffffffec8 = in_stack_fffffffffffffec8 + 1) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QItemSelectionRange>::at
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdf0,
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        QItemSelectionRange::parent(in_stack_fffffffffffffdf0);
        ppQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                  ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                *)in_stack_fffffffffffffdf0);
        iVar4 = (*((*ppQVar9)->super_QObject)._vptr_QObject[0x10])(*ppQVar9,&local_38);
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        ppQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                  ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                *)in_stack_fffffffffffffdf0);
        pQVar1 = *ppQVar9;
        QList<QItemSelectionRange>::at
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdf0,
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        uVar5 = QItemSelectionRange::top((QItemSelectionRange *)0x82a3d9);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])(&local_58,pQVar1,(ulong)uVar5,0,&local_38);
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        ppQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                  ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                *)in_stack_fffffffffffffdf0);
        pQVar1 = *ppQVar9;
        QList<QItemSelectionRange>::at
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdf0,
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        uVar5 = QItemSelectionRange::bottom((QItemSelectionRange *)0x82a468);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (&local_78,pQVar1,(ulong)uVar5,(ulong)(iVar4 - 1),&local_38);
        QItemSelection::QItemSelection
                  (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   (QModelIndex *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                  ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdf0,
                   in_stack_fffffffffffffdec);
        puVar2 = _local_b8;
        command_01.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
        super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             SUB84((ulong)_local_b8 >> 0x20,0);
        QItemSelection::merge
                  ((QItemSelection *)in_RDX,
                   (QItemSelection *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   command_01);
        _local_b8 = puVar2;
        QItemSelection::~QItemSelection((QItemSelection *)0x82a4f7);
      }
    }
    local_98.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QFlags<QItemSelectionModel::SelectionFlag>::operator&
                   ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdf0,
                    in_stack_fffffffffffffdec);
    bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_98);
    if (bVar3) {
      for (local_14c = 0; qVar8 = QList<QItemSelectionRange>::size(in_RDX), local_14c < qVar8;
          local_14c = local_14c + 1) {
        _local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QItemSelectionRange>::at
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdf0,
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        QItemSelectionRange::parent(in_stack_fffffffffffffdf0);
        ppQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                  ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                *)in_stack_fffffffffffffdf0);
        iVar4 = (*((*ppQVar9)->super_QObject)._vptr_QObject[0xf])(*ppQVar9,local_b8);
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
        ppQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                  ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                *)in_stack_fffffffffffffdf0);
        this_00 = (QItemSelection *)*ppQVar9;
        QList<QItemSelectionRange>::at
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdf0,
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        uVar5 = QItemSelectionRange::left((QItemSelectionRange *)0x82a6a8);
        (**(_func_int **)&(this_00->super_QList<QItemSelectionRange>).d.d[6].super_QArrayData)
                  (&local_d8,this_00,0,(ulong)uVar5,local_b8);
        local_f8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        topLeft = (QModelIndex *)
                  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                  ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                *)in_stack_fffffffffffffdf0);
        pQVar1 = *(QAbstractItemModel **)topLeft;
        uVar5 = iVar4 - 1;
        QList<QItemSelectionRange>::at
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdf0,
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        uVar6 = QItemSelectionRange::right((QItemSelectionRange *)0x82a744);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (&local_f8,pQVar1,(ulong)uVar5,(ulong)uVar6,local_b8);
        QItemSelection::QItemSelection(this_00,topLeft,(QModelIndex *)CONCAT44(uVar6,uVar5));
        QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                  ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdf0,
                   in_stack_fffffffffffffdec);
        puVar2 = _local_b8;
        command_01.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
        super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             SUB84((ulong)_local_b8 >> 0x20,0);
        command_00.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
        super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             command_01.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i;
        _local_b8 = puVar2;
        QItemSelection::merge
                  ((QItemSelection *)in_RDX,
                   (QItemSelection *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   command_00);
        QItemSelection::~QItemSelection((QItemSelection *)0x82a7ce);
      }
    }
  }
  else {
    QItemSelection::QItemSelection
              ((QItemSelection *)in_stack_fffffffffffffdf0,
               (QItemSelection *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QItemSelection QItemSelectionModelPrivate::expandSelection(const QItemSelection &selection,
                                                           QItemSelectionModel::SelectionFlags command) const
{
    if (selection.isEmpty() && !((command & QItemSelectionModel::Rows) ||
                                 (command & QItemSelectionModel::Columns)))
        return selection;

    QItemSelection expanded;
    if (command & QItemSelectionModel::Rows) {
        for (int i = 0; i < selection.size(); ++i) {
            QModelIndex parent = selection.at(i).parent();
            int colCount = model->columnCount(parent);
            QModelIndex tl = model->index(selection.at(i).top(), 0, parent);
            QModelIndex br = model->index(selection.at(i).bottom(), colCount - 1, parent);
            //we need to merge because the same row could have already been inserted
            expanded.merge(QItemSelection(tl, br), QItemSelectionModel::Select);
        }
    }
    if (command & QItemSelectionModel::Columns) {
        for (int i = 0; i < selection.size(); ++i) {
            QModelIndex parent = selection.at(i).parent();
            int rowCount = model->rowCount(parent);
            QModelIndex tl = model->index(0, selection.at(i).left(), parent);
            QModelIndex br = model->index(rowCount - 1, selection.at(i).right(), parent);
            //we need to merge because the same column could have already been inserted
            expanded.merge(QItemSelection(tl, br), QItemSelectionModel::Select);
        }
    }
    return expanded;
}